

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

GLenum __thiscall
gl4cts::GPUShaderFP64Test2::getDrawPrimitiveType(GPUShaderFP64Test2 *this,shaderStage shader_stage)

{
  GLenum GVar1;
  
  GVar1 = 0;
  if (shader_stage - FRAGMENT_SHADER < 5) {
    GVar1 = *(GLenum *)(&DAT_0168e748 + (ulong)(shader_stage - FRAGMENT_SHADER) * 4);
  }
  return GVar1;
}

Assistant:

glw::GLenum GPUShaderFP64Test2::getDrawPrimitiveType(shaderStage shader_stage) const
{
	switch (shader_stage)
	{
	case FRAGMENT_SHADER:
		return GL_TRIANGLE_FAN;
		break;

	case GEOMETRY_SHADER:
	case VERTEX_SHADER:
		return GL_POINTS;
		break;

	case TESS_CTRL_SHADER:
	case TESS_EVAL_SHADER:
		return GL_PATCHES;
		break;

	default:
		return GL_NONE;
		break;
	}
}